

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall
HighsLp::deleteColsFromVectors
          (HighsLp *this,HighsInt *new_num_col,HighsIndexCollection *index_collection)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_00;
  reference pvVar7;
  HighsIndexCollection *in_RDX;
  int *in_RSI;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_RDI;
  byte bVar8;
  byte bVar9;
  HighsInt col;
  HighsInt k;
  bool have_integrality;
  bool have_names;
  HighsInt col_dim;
  HighsInt current_set_entry;
  HighsInt keep_to_col;
  HighsInt keep_from_col;
  HighsInt delete_to_col;
  HighsInt delete_from_col;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt *in_stack_ffffffffffffff98;
  HighsInt *in_stack_ffffffffffffffa0;
  HighsInt *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc4;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c [3];
  int *local_10;
  
  local_10 = in_RSI;
  limits(in_RDX,local_1c,&local_20);
  *local_10 = *(int *)&(((_Vector_base<double,_std::allocator<double>_> *)
                        &in_RDI->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                       _M_impl).super__Vector_impl_data._M_start;
  if (local_1c[0] <= local_20) {
    iVar2 = *(int *)&(((_Vector_base<double,_std::allocator<double>_> *)
                      &in_RDI->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                     _M_impl).super__Vector_impl_data._M_start;
    *local_10 = 0;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(((_Vector_base<double,_std::allocator<double>_> *)
                        &in_RDI[0xd].super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                        )->_M_impl).super__Vector_impl_data._M_end_of_storage);
    bVar8 = sVar4 != 0;
    sVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                       &(((_Vector_base<double,_std::allocator<double>_> *)
                         &in_RDI[0xf].
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->_M_impl)
                        .super__Vector_impl_data._M_end_of_storage);
    bVar9 = sVar4 != 0;
    for (iVar3 = local_1c[0]; iVar3 <= local_20; iVar3 = iVar3 + 1) {
      updateOutInIndex((HighsIndexCollection *)
                       CONCAT17(bVar8,CONCAT16(bVar9,CONCAT24(in_stack_ffffffffffffffc4,iVar3))),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (HighsInt *)in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff98);
      if (iVar3 == local_1c[0]) {
        *local_10 = local_24;
      }
      in_stack_ffffffffffffffbc = local_2c;
      if (iVar2 + -1 <= local_28) break;
      for (; in_stack_ffffffffffffffbc < 0;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(((_Vector_base<double,_std::allocator<double>_> *)
                              &in_RDI->
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                             _M_impl).super__Vector_impl_data._M_finish,
                            (long)in_stack_ffffffffffffffbc);
        in_stack_ffffffffffffff98 = (HighsInt *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(((_Vector_base<double,_std::allocator<double>_> *)
                              &in_RDI->
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                             _M_impl).super__Vector_impl_data._M_finish,(long)*local_10);
        *pvVar5 = (value_type)in_stack_ffffffffffffff98;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(((_Vector_base<double,_std::allocator<double>_> *)
                              &in_RDI[1].
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                             _M_impl).super__Vector_impl_data._M_finish,
                            (long)in_stack_ffffffffffffffbc);
        in_stack_ffffffffffffffa0 = (HighsInt *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(((_Vector_base<double,_std::allocator<double>_> *)
                              &in_RDI[1].
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                             _M_impl).super__Vector_impl_data._M_finish,(long)*local_10);
        *pvVar5 = (value_type)in_stack_ffffffffffffffa0;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(((_Vector_base<double,_std::allocator<double>_> *)
                              &in_RDI[2].
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                             _M_impl).super__Vector_impl_data._M_finish,
                            (long)in_stack_ffffffffffffffbc);
        in_stack_ffffffffffffffa8 = (HighsInt *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(((_Vector_base<double,_std::allocator<double>_> *)
                              &in_RDI[2].
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                             _M_impl).super__Vector_impl_data._M_finish,(long)*local_10);
        *pvVar5 = (value_type)in_stack_ffffffffffffffa8;
        if ((bVar8 & 1) != 0) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&(((_Vector_base<double,_std::allocator<double>_> *)
                                     &in_RDI[0xd].
                                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                     )->_M_impl).super__Vector_impl_data._M_end_of_storage,
                                (long)in_stack_ffffffffffffffbc);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&(((_Vector_base<double,_std::allocator<double>_> *)
                                      &in_RDI[0xd].
                                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                      )->_M_impl).super__Vector_impl_data._M_end_of_storage,
                                 (long)*local_10);
          std::__cxx11::string::operator=((string *)this_00,(string *)pvVar6);
        }
        if ((bVar9 & 1) != 0) {
          pvVar7 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              &(((_Vector_base<double,_std::allocator<double>_> *)
                                &in_RDI[0xf].
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                               _M_impl).super__Vector_impl_data._M_end_of_storage,
                              (long)in_stack_ffffffffffffffbc);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              &(((_Vector_base<double,_std::allocator<double>_> *)
                                &in_RDI[0xf].
                                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)->
                               _M_impl).super__Vector_impl_data._M_end_of_storage,(long)*local_10);
          *pvVar7 = vVar1;
        }
        *local_10 = *local_10 + 1;
      }
      if (iVar2 + -1 < 0) break;
    }
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_RDI,
               (size_type)in_stack_ffffffffffffffa8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_RDI,
               (size_type)in_stack_ffffffffffffffa8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_RDI,
               (size_type)in_stack_ffffffffffffffa8);
    if ((bVar9 & 1) != 0) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                (in_RDI,(size_type)in_stack_ffffffffffffffa8);
    }
    if ((bVar8 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI,(size_type)in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteColsFromVectors(
    HighsInt& new_num_col, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_col in case none is removed due to from_k > to_k
  new_num_col = this->num_col_;
  if (from_k > to_k) return;

  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  HighsInt col_dim = this->num_col_;
  new_num_col = 0;
  bool have_names = (this->col_names_.size() != 0);
  bool have_integrality = (this->integrality_.size() != 0);
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    // Account for the initial columns being kept
    if (k == from_k) new_num_col = delete_from_col;
    if (delete_to_col >= col_dim - 1) break;
    assert(delete_to_col < col_dim);
    for (HighsInt col = keep_from_col; col <= keep_to_col; col++) {
      this->col_cost_[new_num_col] = this->col_cost_[col];
      this->col_lower_[new_num_col] = this->col_lower_[col];
      this->col_upper_[new_num_col] = this->col_upper_[col];
      if (have_names) this->col_names_[new_num_col] = this->col_names_[col];
      if (have_integrality)
        this->integrality_[new_num_col] = this->integrality_[col];
      new_num_col++;
    }
    if (keep_to_col >= col_dim - 1) break;
  }
  this->col_cost_.resize(new_num_col);
  this->col_lower_.resize(new_num_col);
  this->col_upper_.resize(new_num_col);
  if (have_integrality) this->integrality_.resize(new_num_col);
  if (have_names) this->col_names_.resize(new_num_col);
}